

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void db_close_and_remove(void)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  undefined1 *puVar5;
  fdb_status fVar6;
  int iVar7;
  code *__s;
  size_t sVar8;
  size_t sVar9;
  size_t bodylen;
  fdb_kvs_config *pfVar10;
  time_t tVar11;
  uint8_t *puVar12;
  ulong uVar13;
  fdb_file_handle **ptr_fhandle;
  long lVar14;
  fdb_kvs_handle **ppfVar15;
  fdb_config *fconfig;
  uint uVar16;
  char *info;
  kvs_ops_stat *pkVar17;
  char *pcVar18;
  char *pcVar19;
  fdb_kvs_handle *pfVar20;
  fdb_doc *info_00;
  fdb_doc *pfVar21;
  char *info_01;
  btree *pbVar22;
  fdb_doc **ppfVar23;
  fdb_doc *pfVar24;
  bool bVar25;
  timeval tVar26;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  int iStack_1bc4;
  fdb_doc *pfStack_1bc0;
  fdb_file_handle *pfStack_1bb8;
  undefined4 uStack_1bb0;
  undefined3 uStack_1bac;
  undefined1 uStack_1ba9;
  fdb_kvs_handle *pfStack_1ba8;
  uint uStack_1b9c;
  timeval tStack_1b98;
  timeval tStack_1b88;
  timeval tStack_1b78;
  fdb_file_info fStack_1b68;
  char acStack_1b20 [1032];
  fdb_config *pfStack_1718;
  fdb_doc *pfStack_1710;
  fdb_doc *pfStack_1708;
  btree *pbStack_1700;
  fdb_doc *pfStack_16f8;
  kvs_ops_stat *pkStack_16f0;
  btree *pbStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_doc *pfStack_16d0;
  fdb_iterator *pfStack_16c8;
  undefined8 uStack_16c0;
  fdb_kvs_handle *apfStack_16b8 [4];
  undefined1 auStack_1698 [64];
  undefined1 auStack_1658 [32];
  undefined1 auStack_1638 [56];
  undefined1 auStack_1600 [40];
  fdb_doc fStack_15d8;
  char acStack_1588 [256];
  undefined1 auStack_1488 [16];
  undefined1 auStack_1478 [16];
  undefined1 auStack_1468 [16];
  undefined1 auStack_1458 [16];
  undefined1 auStack_1448 [16];
  fdb_doc afStack_1438 [3];
  fdb_config fStack_1338;
  char *pcStack_1240;
  fdb_doc *pfStack_1238;
  fdb_doc *pfStack_1230;
  fdb_config *pfStack_1228;
  undefined1 *puStack_1220;
  code *pcStack_1218;
  undefined1 auStack_1210 [24];
  fdb_config fStack_11f8;
  char acStack_1100 [256];
  char acStack_1000 [256];
  fdb_kvs_handle **ppfStack_f00;
  fdb_kvs_config *pfStack_ef8;
  fdb_doc **ppfStack_ef0;
  fdb_doc *pfStack_ed8;
  fdb_kvs_handle *pfStack_ed0;
  fdb_kvs_handle *pfStack_ec8;
  fdb_file_handle *pfStack_ec0;
  fdb_kvs_handle *pfStack_eb8;
  fdb_kvs_config fStack_eb0;
  timeval tStack_e98;
  fdb_doc *apfStack_e88 [31];
  fdb_config fStack_d90;
  char acStack_c98 [256];
  char acStack_b98 [256];
  char acStack_a98 [264];
  fdb_kvs_handle **ppfStack_990;
  fdb_doc *pfStack_988;
  fdb_doc *pfStack_980;
  fdb_kvs_config *pfStack_978;
  fdb_doc *pfStack_970;
  code *pcStack_968;
  fdb_kvs_handle *pfStack_958;
  undefined1 auStack_950 [16];
  fdb_kvs_config fStack_940;
  fdb_kvs_config fStack_920;
  timeval tStack_908;
  fdb_config fStack_8f8;
  fdb_doc afStack_800 [3];
  fdb_doc afStack_700 [3];
  fdb_kvs_config afStack_600 [11];
  fdb_file_handle **ppfStack_4f8;
  long lStack_4f0;
  fdb_doc *pfStack_4e8;
  size_t sStack_4e0;
  fdb_doc **ppfStack_4d8;
  code *pcStack_4d0;
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  timeval local_4b0;
  fdb_kvs_config local_4a0;
  fdb_doc *apfStack_488 [10];
  char local_438 [264];
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  pcStack_4d0 = (code *)0x11205b;
  gettimeofday(&local_4b0,(__timezone_ptr_t)0x0);
  pcStack_4d0 = (code *)0x112060;
  memleak_start();
  pcStack_4d0 = (code *)0x11206c;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_4d0 = (code *)0x11207c;
  fdb_get_default_config();
  pcStack_4d0 = (code *)0x112089;
  fdb_get_default_kvs_config();
  local_330.cleanup_cache_onclose = false;
  pcStack_4d0 = (code *)0x1120a4;
  fdb_open(&local_4b8,"./dummy1",&local_330);
  pcStack_4d0 = (code *)0x1120b6;
  fdb_kvs_open(local_4b8,&local_4c0,(char *)0x0,&local_4a0);
  info_00 = (fdb_doc *)0x0;
  uVar13 = 0;
  do {
    pcStack_4d0 = (code *)0x1120d6;
    sprintf(local_138,"key%d",uVar13 & 0xffffffff);
    pcStack_4d0 = (code *)0x1120ee;
    sprintf(local_238,"meta%d",uVar13 & 0xffffffff);
    pcStack_4d0 = (code *)0x112106;
    sprintf(local_438,"body%d",uVar13 & 0xffffffff);
    ppfVar23 = (fdb_doc **)((long)apfStack_488 + (long)info_00);
    pcStack_4d0 = (code *)0x112116;
    __s = (code *)strlen(local_138);
    pcVar18 = local_238;
    pcStack_4d0 = (code *)0x112129;
    sVar8 = strlen(pcVar18);
    pcStack_4d0 = (code *)0x112139;
    sVar9 = strlen(local_438);
    pcStack_4d0 = (code *)0x11215e;
    fdb_doc_create(ppfVar23,local_138,(size_t)__s,pcVar18,sVar8,local_438,sVar9);
    pcStack_4d0 = (code *)0x11216d;
    fdb_set(local_4c0,apfStack_488[uVar13]);
    pcStack_4d0 = (code *)0x112177;
    fdb_doc_free(apfStack_488[uVar13]);
    uVar13 = uVar13 + 1;
    info_00 = (fdb_doc *)((long)info_00 + 8);
  } while (uVar13 != 10);
  pcStack_4d0 = (code *)0x112194;
  fVar6 = fdb_commit(local_4b8,'\0');
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcStack_4d0 = (code *)0x1121a6;
    fdb_kvs_close(local_4c0);
    ptr_fhandle = &local_4b8;
    pcStack_4d0 = (code *)0x1121b3;
    fdb_close(local_4b8);
    pcStack_4d0 = (code *)0x1121bf;
    system("rm -rf  dummy* > errorlog.txt");
    local_330.flags = 2;
    pcStack_4d0 = (code *)0x1121dd;
    fVar6 = fdb_open(ptr_fhandle,"./dummy1",&local_330);
    if (fVar6 == FDB_RESULT_NO_SUCH_FILE) {
      pcStack_4d0 = (code *)0x1121e7;
      fdb_shutdown();
      pcStack_4d0 = (code *)0x1121ec;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (db_close_and_remove()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_4d0 = (code *)0x11221d;
      fprintf(_stderr,pcVar18,"db close and remove");
      return;
    }
  }
  else {
    pcStack_4d0 = (code *)0x112234;
    db_close_and_remove();
    ptr_fhandle = (fdb_file_handle **)0xa;
  }
  pcStack_4d0 = db_drop_test;
  db_close_and_remove();
  pcStack_968 = (code *)0x112256;
  ppfStack_4f8 = ptr_fhandle;
  lStack_4f0 = (long)info_00;
  pfStack_4e8 = (fdb_doc *)__s;
  sStack_4e0 = sVar8;
  ppfStack_4d8 = ppfVar23;
  pcStack_4d0 = (code *)pcVar18;
  gettimeofday(&tStack_908,(__timezone_ptr_t)0x0);
  pcStack_968 = (code *)0x11225b;
  memleak_start();
  pfStack_958 = (fdb_kvs_handle *)0x0;
  pcStack_968 = (code *)0x112270;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_968 = (code *)0x11227d;
  fdb_get_default_config();
  pfVar10 = &fStack_920;
  pcStack_968 = (code *)0x11228a;
  fdb_get_default_kvs_config();
  fStack_8f8.buffercache_size = 0x1000000;
  fStack_8f8.wal_threshold = 0x400;
  fStack_8f8.flags = 1;
  fStack_8f8.compaction_threshold = '\0';
  pfVar24 = (fdb_doc *)(auStack_950 + 8);
  pcStack_968 = (code *)0x1122bc;
  fdb_open((fdb_file_handle **)pfVar24,"./dummy1",&fStack_8f8);
  ppfVar15 = (fdb_kvs_handle **)auStack_950;
  pcStack_968 = (code *)0x1122d1;
  fdb_kvs_open((fdb_file_handle *)auStack_950._8_8_,ppfVar15,(char *)0x0,pfVar10);
  pcStack_968 = (code *)0x1122e7;
  fVar6 = fdb_set_log_callback((fdb_kvs_handle *)auStack_950._0_8_,logCallbackFunc,"db_drop_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfVar10 = afStack_600;
    pcStack_968 = (code *)0x11230a;
    sprintf(&pfVar10->create_if_missing,"key%d",0);
    info_00 = afStack_700;
    pcStack_968 = (code *)0x112325;
    sprintf((char *)info_00,"meta%d",0);
    __s = (code *)afStack_800;
    pcStack_968 = (code *)0x112340;
    sprintf((char *)__s,"body%d",0);
    pcStack_968 = (code *)0x112348;
    sVar8 = strlen(&pfVar10->create_if_missing);
    pcStack_968 = (code *)0x112353;
    sVar9 = strlen((char *)info_00);
    pcStack_968 = (code *)0x11235e;
    bodylen = strlen((char *)__s);
    pcStack_968 = (code *)0x11237e;
    fdb_doc_create((fdb_doc **)&fStack_940,pfVar10,sVar8,info_00,sVar9,__s,bodylen);
    pfVar24 = (fdb_doc *)auStack_950;
    pcStack_968 = (code *)0x11238e;
    fdb_set((fdb_kvs_handle *)auStack_950._0_8_,(fdb_doc *)fStack_940._0_8_);
    pcStack_968 = (code *)0x1123a4;
    sprintf(&pfVar10->create_if_missing,"key%d",1);
    pcStack_968 = (code *)0x1123ba;
    sprintf((char *)info_00,"meta%d",1);
    pcStack_968 = (code *)0x1123d0;
    sprintf((char *)__s,"body%d",1);
    pcStack_968 = (code *)0x1123d8;
    pcVar18 = (char *)strlen(&pfVar10->create_if_missing);
    pcStack_968 = (code *)0x1123e3;
    sVar8 = strlen((char *)info_00);
    pcStack_968 = (code *)0x1123ee;
    sVar9 = strlen((char *)__s);
    pcStack_968 = (code *)0x11240b;
    fdb_doc_create((fdb_doc **)&fStack_940.custom_cmp,pfVar10,(size_t)pcVar18,info_00,sVar8,__s,
                   sVar9);
    pcStack_968 = (code *)0x11241c;
    fdb_set((fdb_kvs_handle *)auStack_950._0_8_,(fdb_doc *)fStack_940.custom_cmp);
    ppfVar15 = (fdb_kvs_handle **)(auStack_950 + 8);
    pcStack_968 = (code *)0x11242b;
    fdb_commit((fdb_file_handle *)auStack_950._8_8_,'\0');
    pcStack_968 = (code *)0x112433;
    fdb_kvs_close((fdb_kvs_handle *)auStack_950._0_8_);
    pcStack_968 = (code *)0x11243b;
    fdb_close((fdb_file_handle *)auStack_950._8_8_);
    pcStack_968 = (code *)0x112447;
    system("rm -rf  dummy1 > errorlog.txt");
    pcStack_968 = (code *)0x11245b;
    fdb_open((fdb_file_handle **)ppfVar15,"./dummy1",&fStack_8f8);
    pcStack_968 = (code *)0x11246b;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_950._8_8_,(fdb_kvs_handle **)pfVar24,&fStack_920);
    pcStack_968 = (code *)0x112481;
    fVar6 = fdb_set_log_callback((fdb_kvs_handle *)auStack_950._0_8_,logCallbackFunc,"db_drop_test")
    ;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112618;
    pcStack_968 = (code *)0x1124a4;
    sprintf(&afStack_600[0].create_if_missing,"key%d",0);
    pfVar24 = afStack_700;
    pcStack_968 = (code *)0x1124bf;
    sprintf((char *)pfVar24,"meta%d",0);
    info_00 = afStack_800;
    pcStack_968 = (code *)0x1124da;
    sprintf((char *)info_00,"body%d",0);
    pfVar10 = &fStack_940;
    pcStack_968 = (code *)0x1124e7;
    fdb_doc_free((fdb_doc *)fStack_940._0_8_);
    pcStack_968 = (code *)0x1124ef;
    __s = (code *)strlen(&afStack_600[0].create_if_missing);
    pcStack_968 = (code *)0x1124fa;
    pcVar18 = (char *)strlen((char *)pfVar24);
    pcStack_968 = (code *)0x112505;
    sVar8 = strlen((char *)info_00);
    pcStack_968 = (code *)0x112520;
    fdb_doc_create((fdb_doc **)pfVar10,afStack_600,(size_t)__s,pfVar24,(size_t)pcVar18,info_00,sVar8
                  );
    pcStack_968 = (code *)0x11252d;
    fdb_set((fdb_kvs_handle *)auStack_950._0_8_,(fdb_doc *)fStack_940._0_8_);
    pcStack_968 = (code *)0x112539;
    fdb_commit((fdb_file_handle *)auStack_950._8_8_,'\0');
    ppfVar15 = &pfStack_958;
    pcStack_968 = (code *)0x112560;
    fdb_doc_create((fdb_doc **)ppfVar15,*(void **)(fStack_940._0_8_ + 0x20),
                   *(size_t *)fStack_940._0_8_,(void *)0x0,0,(void *)0x0,0);
    pcStack_968 = (code *)0x11256d;
    fVar6 = fdb_get((fdb_kvs_handle *)auStack_950._0_8_,(fdb_doc *)pfStack_958);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      if (pfStack_958->fhandle != (fdb_file_handle *)0x1) {
        pcStack_968 = (code *)0x11258b;
        db_drop_test();
      }
      pcStack_968 = (code *)0x112595;
      fdb_kvs_close((fdb_kvs_handle *)auStack_950._0_8_);
      pcStack_968 = (code *)0x11259f;
      fdb_close((fdb_file_handle *)auStack_950._8_8_);
      pcStack_968 = (code *)0x1125a9;
      fdb_doc_free((fdb_doc *)pfStack_958);
      pfStack_958 = (fdb_kvs_handle *)0x0;
      pcStack_968 = (code *)0x1125bc;
      fdb_doc_free((fdb_doc *)fStack_940._0_8_);
      pcStack_968 = (code *)0x1125c6;
      fdb_doc_free((fdb_doc *)fStack_940.custom_cmp);
      pcStack_968 = (code *)0x1125cb;
      fdb_shutdown();
      pcStack_968 = (code *)0x1125d0;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (db_drop_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_968 = (code *)0x112601;
      fprintf(_stderr,pcVar18,"Database drop test");
      return;
    }
  }
  else {
    pcStack_968 = (code *)0x112618;
    db_drop_test();
LAB_00112618:
    pcStack_968 = (code *)0x11261d;
    db_drop_test();
  }
  pcStack_968 = db_destroy_test;
  db_drop_test();
  ppfStack_ef0 = (fdb_doc **)0x11263f;
  ppfStack_990 = ppfVar15;
  pfStack_988 = info_00;
  pfStack_980 = (fdb_doc *)__s;
  pfStack_978 = pfVar10;
  pfStack_970 = pfVar24;
  pcStack_968 = (code *)pcVar18;
  gettimeofday(&tStack_e98,(__timezone_ptr_t)0x0);
  ppfStack_ef0 = (fdb_doc **)0x112644;
  memleak_start();
  pfStack_ed0 = (fdb_kvs_handle *)0x0;
  ppfStack_ef0 = (fdb_doc **)0x112659;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_ef0 = (fdb_doc **)0x112669;
  fdb_get_default_config();
  pfVar10 = &fStack_eb0;
  ppfStack_ef0 = (fdb_doc **)0x112676;
  fdb_get_default_kvs_config();
  fStack_d90.buffercache_size = 0x1000000;
  fStack_d90.wal_threshold = 0x400;
  fStack_d90.flags = 1;
  fStack_d90.compaction_threshold = '\0';
  ppfVar23 = &pfStack_ed8;
  ppfStack_ef0 = (fdb_doc **)0x1126a8;
  fdb_open((fdb_file_handle **)ppfVar23,"./dummy1",&fStack_d90);
  ppfVar15 = &pfStack_ec8;
  ppfStack_ef0 = (fdb_doc **)0x1126bd;
  fdb_kvs_open((fdb_file_handle *)pfStack_ed8,ppfVar15,(char *)0x0,pfVar10);
  ppfStack_ef0 = (fdb_doc **)0x1126d3;
  fVar6 = fdb_set_log_callback(pfStack_ec8,logCallbackFunc,"db_destroy_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    info_00 = (fdb_doc *)0x0;
    uVar13 = 0;
    do {
      ppfStack_ef0 = (fdb_doc **)0x1126fb;
      sprintf(acStack_a98,"key%d",uVar13 & 0xffffffff);
      ppfStack_ef0 = (fdb_doc **)0x112713;
      sprintf(acStack_b98,"meta%d",uVar13 & 0xffffffff);
      ppfStack_ef0 = (fdb_doc **)0x11272b;
      sprintf(acStack_c98,"body%d",uVar13 & 0xffffffff);
      ppfVar23 = (fdb_doc **)((long)apfStack_e88 + (long)info_00);
      ppfStack_ef0 = (fdb_doc **)0x11273b;
      __s = (code *)strlen(acStack_a98);
      pcVar18 = acStack_b98;
      ppfStack_ef0 = (fdb_doc **)0x11274e;
      pfVar10 = (fdb_kvs_config *)strlen(pcVar18);
      ppfStack_ef0 = (fdb_doc **)0x11275e;
      sVar8 = strlen(acStack_c98);
      ppfStack_ef0 = (fdb_doc **)0x112783;
      fdb_doc_create(ppfVar23,acStack_a98,(size_t)__s,pcVar18,(size_t)pfVar10,acStack_c98,sVar8);
      ppfStack_ef0 = (fdb_doc **)0x112792;
      fdb_set(pfStack_ec8,apfStack_e88[uVar13]);
      uVar13 = uVar13 + 1;
      info_00 = (fdb_doc *)((long)info_00 + 8);
    } while (uVar13 != 0x1e);
    ppfStack_ef0 = (fdb_doc **)0x1127af;
    fdb_commit((fdb_file_handle *)pfStack_ed8,'\0');
    ppfStack_ef0 = (fdb_doc **)0x1127cb;
    fdb_open(&pfStack_ec0,"./dummy2",&fStack_d90);
    ppfVar15 = &pfStack_eb8;
    ppfStack_ef0 = (fdb_doc **)0x1127e2;
    fdb_kvs_open(pfStack_ec0,ppfVar15,(char *)0x0,&fStack_eb0);
    ppfStack_ef0 = (fdb_doc **)0x1127f8;
    fVar6 = fdb_set_log_callback(pfStack_eb8,logCallbackFunc,"db_destroy_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112987;
    lVar14 = 0;
    do {
      ppfStack_ef0 = (fdb_doc **)0x112811;
      fdb_set(pfStack_eb8,apfStack_e88[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1e);
    ppfStack_ef0 = (fdb_doc **)0x112826;
    fdb_commit(pfStack_ec0,'\0');
    ppfStack_ef0 = (fdb_doc **)0x112830;
    fdb_close((fdb_file_handle *)pfStack_ed8);
    ppfStack_ef0 = (fdb_doc **)0x112844;
    fVar6 = fdb_destroy("./dummy2",&fStack_d90);
    ppfVar15 = (fdb_kvs_handle **)0x1e;
    if (fVar6 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011298c;
    ppfStack_ef0 = (fdb_doc **)0x112857;
    fdb_close(pfStack_ec0);
    ppfStack_ef0 = (fdb_doc **)0x11286b;
    fVar6 = fdb_destroy("./dummy1",&fStack_d90);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112991;
    ppfStack_ef0 = (fdb_doc **)0x11288f;
    fdb_open((fdb_file_handle **)&pfStack_ed8,"./dummy1",&fStack_d90);
    ppfVar15 = &pfStack_ec8;
    ppfStack_ef0 = (fdb_doc **)0x1128a6;
    fdb_kvs_open((fdb_file_handle *)pfStack_ed8,ppfVar15,(char *)0x0,&fStack_eb0);
    ppfStack_ef0 = (fdb_doc **)0x1128bc;
    fVar6 = fdb_set_log_callback(pfStack_ec8,logCallbackFunc,"db_destroy_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112996;
    ppfVar15 = &pfStack_ed0;
    ppfStack_ef0 = (fdb_doc **)0x1128ed;
    fdb_doc_create((fdb_doc **)ppfVar15,apfStack_e88[0]->key,apfStack_e88[0]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_ef0 = (fdb_doc **)0x1128fa;
    fVar6 = fdb_get(pfStack_ec8,(fdb_doc *)pfStack_ed0);
    if (fVar6 == FDB_RESULT_KEY_NOT_FOUND) {
      ppfStack_ef0 = (fdb_doc **)0x11290d;
      fdb_close((fdb_file_handle *)pfStack_ed8);
      ppfStack_ef0 = (fdb_doc **)0x112917;
      fdb_doc_free((fdb_doc *)pfStack_ed0);
      pfStack_ed0 = (fdb_kvs_handle *)0x0;
      lVar14 = 0;
      do {
        ppfStack_ef0 = (fdb_doc **)0x11292c;
        fdb_doc_free(apfStack_e88[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x1e);
      ppfStack_ef0 = (fdb_doc **)0x11293a;
      fdb_shutdown();
      ppfStack_ef0 = (fdb_doc **)0x11293f;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (db_destroy_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_ef0 = (fdb_doc **)0x112970;
      fprintf(_stderr,pcVar18,"Database destroy test");
      return;
    }
  }
  else {
    ppfStack_ef0 = (fdb_doc **)0x112987;
    db_destroy_test();
LAB_00112987:
    ppfStack_ef0 = (fdb_doc **)0x11298c;
    db_destroy_test();
LAB_0011298c:
    ppfStack_ef0 = (fdb_doc **)0x112991;
    db_destroy_test();
LAB_00112991:
    ppfStack_ef0 = (fdb_doc **)0x112996;
    db_destroy_test();
LAB_00112996:
    ppfStack_ef0 = (fdb_doc **)0x11299b;
    db_destroy_test();
  }
  ppfStack_ef0 = (fdb_doc **)db_destroy_test_full_path;
  db_destroy_test();
  pfVar24 = (fdb_doc *)auStack_1210;
  pfVar21 = (fdb_doc *)auStack_1210;
  pcStack_1218 = (code *)0x1129b8;
  ppfStack_f00 = ppfVar15;
  pfStack_ef8 = pfVar10;
  ppfStack_ef0 = ppfVar23;
  gettimeofday((timeval *)(auStack_1210 + 8),(__timezone_ptr_t)0x0);
  pcStack_1218 = (code *)0x1129bd;
  memleak_start();
  pcStack_1218 = (code *)0x1129c4;
  tVar11 = time((time_t *)0x0);
  pcStack_1218 = (code *)0x1129cb;
  srand((uint)tVar11);
  pcStack_1218 = (code *)0x1129d0;
  iVar7 = rand();
  pcStack_1218 = (code *)0x112a08;
  sprintf(acStack_1000,"/tmp/fdb_destroy_test_%d",(ulong)(uint)(iVar7 % 10000));
  pcStack_1218 = (code *)0x112a24;
  sprintf(acStack_1100,"rm -rf %s*",acStack_1000);
  pcStack_1218 = (code *)0x112a2c;
  system(acStack_1100);
  pcStack_1218 = (code *)0x112a39;
  fdb_get_default_config();
  fStack_11f8.compaction_mode = '\x01';
  pcStack_1218 = (code *)0x112a4f;
  fdb_open((fdb_file_handle **)auStack_1210,acStack_1000,&fStack_11f8);
  pcStack_1218 = (code *)0x112a57;
  fdb_close((fdb_file_handle *)auStack_1210._0_8_);
  pcStack_1218 = (code *)0x112a62;
  pcVar19 = acStack_1000;
  fVar6 = fdb_destroy(acStack_1000,&fStack_11f8);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcStack_1218 = (code *)0x112a6b;
    fdb_shutdown();
    pcStack_1218 = (code *)0x112a70;
    memleak_end();
    pcVar18 = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      pcVar18 = "%s FAILED\n";
    }
    pcStack_1218 = (code *)0x112aa1;
    fprintf(_stderr,pcVar18,"Database destroy (full path) test");
    return;
  }
  pcStack_1218 = operational_stats_test;
  db_destroy_test_full_path();
  info = (char *)((ulong)pcVar19 & 0xffffffff);
  info_01 = (char *)0x0;
  pkStack_16f0 = (kvs_ops_stat *)0x112ad8;
  pcStack_1240 = acStack_1000;
  pfStack_1238 = info_00;
  pfStack_1230 = (fdb_doc *)__s;
  pfStack_1228 = &fStack_11f8;
  puStack_1220 = auStack_1210;
  pcStack_1218 = (code *)pcVar18;
  gettimeofday((timeval *)(auStack_1600 + 0x18),(__timezone_ptr_t)0x0);
  pkStack_16f0 = (kvs_ops_stat *)0x112add;
  memleak_start();
  pfStack_16d0 = (fdb_doc *)auStack_1488;
  auStack_1698._0_16_ = (undefined1  [16])0x0;
  auStack_1698._16_8_ = (void *)0x0;
  auStack_1698._24_8_ = (kvs_info *)0x0;
  auStack_1698._32_8_ = (kvs_ops_stat *)0x0;
  auStack_1698._40_8_ = (fdb_file_handle *)0x0;
  auStack_1698._48_8_ = (hbtrie *)0x0;
  auStack_1488 = (undefined1  [16])0x0;
  auStack_1478 = (undefined1  [16])0x0;
  auStack_1458 = (undefined1  [16])0x0;
  auStack_1468._8_8_ = 0;
  auStack_1468._0_8_ = acStack_1588;
  auStack_1448._8_8_ = 0;
  auStack_1448._0_8_ = afStack_1438;
  pkStack_16f0 = (kvs_ops_stat *)0x112b44;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig = &fStack_1338;
  pkStack_16f0 = (kvs_ops_stat *)0x112b54;
  fdb_get_default_config();
  pkStack_16f0 = (kvs_ops_stat *)0x112b61;
  fdb_get_default_kvs_config();
  fStack_1338.buffercache_size = 0;
  fStack_1338.seqtree_opt = '\x01';
  fStack_1338.wal_threshold = 0x400;
  fStack_1338.flags = 1;
  fStack_1338.compaction_threshold = '\0';
  fStack_1338.multi_kv_instances = SUB81(info,0);
  pkStack_16f0 = (kvs_ops_stat *)0x112b94;
  fdb_open((fdb_file_handle **)&pfStack_16d8,"./dummy1",fconfig);
  uStack_16c0._4_4_ = (int)pcVar19;
  if (uStack_16c0._4_4_ != 0) {
    fconfig = (fdb_config *)0x3;
    info_01 = (char *)0x18;
    pfVar24 = (fdb_doc *)(auStack_1658 + 0x20);
    info_00 = (fdb_doc *)auStack_1600;
    __s = logCallbackFunc;
    info = "operational_stats_test";
    do {
      pkStack_16f0 = (kvs_ops_stat *)0x112bdc;
      sprintf((char *)pfVar24,"kv%d",(ulong)fconfig & 0xffffffff);
      pkStack_16f0 = (kvs_ops_stat *)0x112bf4;
      fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_16d8,
                           (fdb_kvs_handle **)((long)apfStack_16b8 + (long)info_01),(char *)pfVar24,
                           (fdb_kvs_config *)info_00);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
      pkStack_16f0 = (kvs_ops_stat *)0x112c0c;
      fVar6 = fdb_set_log_callback
                        (apfStack_16b8[(long)fconfig],logCallbackFunc,"operational_stats_test");
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113168;
      info_01 = (char *)&((btree *)((long)info_01 + -0x38))->aux;
      bVar25 = fconfig != (fdb_config *)0x0;
      fconfig = (fdb_config *)&fconfig[-1].field_0xf7;
    } while (bVar25);
    auStack_1698._56_8_ = (btree *)0x3;
LAB_00112c66:
    puVar12 = &((btree *)auStack_1698._56_8_)->vsize;
    info = auStack_1658 + 0x20;
    fconfig = (fdb_config *)auStack_1698;
    info_01 = (char *)0x0;
    do {
      pkStack_16f0 = (kvs_ops_stat *)0x112ca2;
      sprintf(acStack_1588,"key%d",(ulong)info_01 & 0xffffffff);
      __s = (code *)afStack_1438;
      pkStack_16f0 = (kvs_ops_stat *)0x112cbe;
      sprintf((char *)__s,"body%d",(ulong)info_01 & 0xffffffff);
      info_00 = (fdb_doc *)(&fStack_15d8.keylen + (long)info_01);
      pkStack_16f0 = (kvs_ops_stat *)0x112cd1;
      sVar8 = strlen(acStack_1588);
      pkStack_16f0 = (kvs_ops_stat *)0x112cdd;
      sVar9 = strlen((char *)__s);
      pkStack_16f0 = (kvs_ops_stat *)0x112cff;
      fdb_doc_create((fdb_doc **)info_00,acStack_1588,sVar8 + 1,(void *)0x0,0,__s,sVar9 + 1);
      info_01 = (char *)((long)info_01 + 1);
      pfVar24 = (fdb_doc *)puVar12;
      do {
        pkStack_16f0 = (kvs_ops_stat *)0x112d15;
        fVar6 = fdb_set((fdb_kvs_handle *)(&uStack_16c0)[(long)pfVar24],(fdb_doc *)info_00->keylen);
        if (fVar6 != FDB_RESULT_SUCCESS) {
          pkStack_16f0 = (kvs_ops_stat *)0x1130fe;
          operational_stats_test();
LAB_001130fe:
          pkStack_16f0 = (kvs_ops_stat *)0x113103;
          operational_stats_test();
LAB_00113103:
          pkStack_16f0 = (kvs_ops_stat *)0x113115;
          operational_stats_test();
          goto LAB_00113115;
        }
        pkStack_16f0 = (kvs_ops_stat *)0x112d2a;
        fVar6 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_16c0)[(long)pfVar24],(fdb_kvs_ops_info *)info)
        ;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130fe;
        auStack_1698._0_8_ = info_01;
        pkStack_16f0 = (kvs_ops_stat *)0x112d47;
        iVar7 = bcmp(info,fconfig,0x38);
        if (iVar7 != 0) goto LAB_00113103;
        puVar5 = (undefined1 *)((long)&pfVar24[-1].flags + 3);
        bVar25 = 0 < (long)pfVar24;
        pfVar24 = (fdb_doc *)puVar5;
      } while (puVar5 != (undefined1 *)0x0 && bVar25);
    } while (info_01 != (char *)0xa);
    info_01 = auStack_1658 + 0x20;
    pbStack_16e0 = (btree *)auStack_1698._56_8_;
    do {
      pkStack_16f0 = (kvs_ops_stat *)0x112d98;
      fdb_iterator_init(apfStack_16b8[(long)pbStack_16e0],&pfStack_16c8,(void *)0x0,0,(void *)0x0,0,
                        0);
      pfVar24 = &fStack_15d8;
      pfVar21 = (fdb_doc *)__s;
      do {
        pkStack_16f0 = (kvs_ops_stat *)0x112daf;
        fVar6 = fdb_iterator_get(pfStack_16c8,&pfStack_16d0);
        __s = (code *)pfStack_16d0;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113131;
        fconfig = (fdb_config *)pfStack_16d0->key;
        info_00 = (fdb_doc *)pfVar24->keylen;
        info = (char *)info_00->key;
        pkStack_16f0 = (kvs_ops_stat *)0x112dd7;
        iVar7 = bcmp(fconfig,info,pfStack_16d0->keylen);
        if (iVar7 != 0) goto LAB_00113136;
        fconfig = (fdb_config *)((fdb_doc *)__s)->body;
        info = (char *)info_00->body;
        pkStack_16f0 = (kvs_ops_stat *)0x112df7;
        iVar7 = bcmp(fconfig,info,((fdb_doc *)__s)->bodylen);
        if (iVar7 != 0) goto LAB_00113158;
        pkStack_16f0 = (kvs_ops_stat *)0x112e11;
        fVar6 = fdb_get_kvs_ops_info(apfStack_16b8[(long)pbStack_16e0],(fdb_kvs_ops_info *)info_01);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113141;
        auStack_1698._40_8_ = (long)(fdb_kvs_handle **)auStack_1698._40_8_ + 1;
        auStack_1698._48_8_ = auStack_1698._48_8_ + 1;
        pkStack_16f0 = (kvs_ops_stat *)0x112e3f;
        iVar7 = bcmp(info_01,auStack_1698,0x38);
        if (iVar7 != 0) goto LAB_00113146;
        pkStack_16f0 = (kvs_ops_stat *)0x112e51;
        fVar6 = fdb_iterator_next(pfStack_16c8);
        pfVar24 = (fdb_doc *)&pfVar24->metalen;
        pfVar21 = (fdb_doc *)__s;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      auStack_1698._48_8_ = auStack_1698._48_8_ + 1;
      pkStack_16f0 = (kvs_ops_stat *)0x112e70;
      fdb_iterator_close(pfStack_16c8);
      pkStack_16f0 = (kvs_ops_stat *)0x112e7f;
      fdb_commit((fdb_file_handle *)pfStack_16d8,'\x01');
      auStack_1698._16_8_ = (void *)(auStack_1698._16_8_ + 1);
      pkStack_16f0 = (kvs_ops_stat *)0x112e96;
      fVar6 = fdb_get_kvs_ops_info(apfStack_16b8[(long)pbStack_16e0],(fdb_kvs_ops_info *)info_01);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113184;
      pkStack_16f0 = (kvs_ops_stat *)0x112eb0;
      iVar7 = bcmp(info_01,auStack_1698,0x38);
      if (iVar7 != 0) goto LAB_00113172;
    } while ((pbStack_16e0 != (btree *)0x0) &&
            (auStack_1698._40_8_ = (fdb_file_handle *)0x0, auStack_1698._48_8_ = (hbtrie *)0x0,
            bVar25 = 0 < (long)pbStack_16e0,
            pbStack_16e0 = (btree *)((long)&pbStack_16e0[-1].aux + 7), bVar25));
    auStack_1698._24_8_ = auStack_1698._24_8_ + 1;
    pkStack_16f0 = (kvs_ops_stat *)0x112ee9;
    fdb_compact((fdb_file_handle *)pfStack_16d8,"./dummy2");
    pkStack_16f0 = (kvs_ops_stat *)0x112efb;
    fVar6 = fdb_get_kvs_ops_info(apfStack_16b8[0],(fdb_kvs_ops_info *)(auStack_1658 + 0x20));
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113189;
    pkStack_16f0 = (kvs_ops_stat *)0x112f1a;
    iVar7 = bcmp(auStack_1658 + 0x20,auStack_1698,0x38);
    info_01 = (char *)auStack_1698._56_8_;
    if (iVar7 == 0) {
      pfVar24 = (fdb_doc *)(auStack_1698._56_8_ + 1);
      info_00 = (fdb_doc *)(auStack_1658 + 0x20);
      __s = (code *)auStack_1698;
      pkVar17 = (kvs_ops_stat *)0x0;
      do {
        fconfig = (fdb_config *)((ulong)pkVar17 & 0xffffffff);
        pkStack_16f0 = (kvs_ops_stat *)0x112f56;
        sprintf(acStack_1588,"key%d",(ulong)pkVar17 & 0xffffffff);
        info = (char *)((long)&(pkVar17->num_sets).super___atomic_base<unsigned_long>._M_i + 1);
        info_01 = (char *)pfVar24;
        do {
          if (((ulong)pkVar17 & 1) == 0) {
            if (((ulong)pkVar17 & 2) == 0) {
              pkStack_16f0 = (kvs_ops_stat *)0x112f75;
              fVar6 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_16c0)[(long)info_01],pfStack_16d0)
              ;
            }
            else {
              pfStack_16d0->seqnum = (fdb_seqnum_t)info;
              pkStack_16f0 = (kvs_ops_stat *)0x112f9b;
              fVar6 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_16c0)[(long)info_01],pfStack_16d0);
            }
          }
          else {
            pkStack_16f0 = (kvs_ops_stat *)0x112f86;
            fVar6 = fdb_get((fdb_kvs_handle *)(&uStack_16c0)[(long)info_01],pfStack_16d0);
          }
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113115;
          pkStack_16f0 = (kvs_ops_stat *)0x112fb0;
          fVar6 = fdb_get_kvs_ops_info
                            ((fdb_kvs_handle *)(&uStack_16c0)[(long)info_01],
                             (fdb_kvs_ops_info *)info_00);
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
          pkStack_16f0 = (kvs_ops_stat *)0x112fcd;
          auStack_1698._32_8_ = info;
          iVar7 = bcmp(info_00,__s,0x38);
          if (iVar7 != 0) goto LAB_0011311f;
          pbVar22 = (btree *)((long)&((btree *)((long)info_01 + -0x38))->aux + 7);
          bVar25 = 0 < (long)info_01;
          info_01 = (char *)pbVar22;
        } while (pbVar22 != (btree *)0x0 && bVar25);
        pkVar17 = (kvs_ops_stat *)info;
      } while ((kvs_ops_stat *)info != (kvs_ops_stat *)0xa);
      fconfig = (fdb_config *)auStack_1658;
      pfVar24 = (fdb_doc *)&stderr;
      info_01 = "%d:\t%u\t%u\t%u\t%lu\n";
      info = (char *)0x0;
      while( true ) {
        auStack_1658._0_16_ = (undefined1  [16])0x0;
        auStack_1658._16_8_ = (docio_handle *)0x0;
        pkStack_16f0 = (kvs_ops_stat *)0x113029;
        fVar6 = fdb_get_latency_stats
                          ((fdb_file_handle *)pfStack_16d8,(fdb_latency_stat *)fconfig,
                           (fdb_latency_stat_type)info);
        if (fVar6 != FDB_RESULT_SUCCESS) break;
        pkStack_16f0 = (kvs_ops_stat *)0x11305e;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",info);
        uVar16 = (int)info + 1;
        info = (char *)(ulong)uVar16;
        if (uVar16 == 0x13) {
          pkStack_16f0 = (kvs_ops_stat *)0x11306f;
          fdb_close((fdb_file_handle *)pfStack_16d8);
          lVar14 = 0;
          do {
            pkStack_16f0 = (kvs_ops_stat *)0x11307e;
            fdb_doc_free((fdb_doc *)(&fStack_15d8.keylen)[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 10);
          pkStack_16f0 = (kvs_ops_stat *)0x11308c;
          fdb_shutdown();
          pkStack_16f0 = (kvs_ops_stat *)0x113091;
          memleak_end();
          pcVar18 = "single kv instance";
          if (uStack_16c0._4_1_ != '\0') {
            pcVar18 = "multiple kv instances";
          }
          pkStack_16f0 = (kvs_ops_stat *)0x1130c1;
          sprintf((char *)afStack_1438,"Operational stats test %s",pcVar18);
          pcVar18 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar18 = "%s FAILED\n";
          }
          pkStack_16f0 = (kvs_ops_stat *)0x1130e7;
          fprintf(_stderr,pcVar18,afStack_1438);
          return;
        }
      }
      goto LAB_00113163;
    }
    goto LAB_0011318e;
  }
  pkStack_16f0 = (kvs_ops_stat *)0x112c3c;
  pfVar20 = pfStack_16d8;
  fVar6 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_16d8,apfStack_16b8,(fdb_kvs_config *)auStack_1600);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pkStack_16f0 = (kvs_ops_stat *)0x112c5c;
    pfVar20 = apfStack_16b8[0];
    fVar6 = fdb_set_log_callback(apfStack_16b8[0],logCallbackFunc,"operational_stats_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001131a5;
    auStack_1698._56_8_ = (btree *)0x0;
    goto LAB_00112c66;
  }
  goto LAB_001131a0;
LAB_00113115:
  pkStack_16f0 = (kvs_ops_stat *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pkStack_16f0 = (kvs_ops_stat *)0x11311f;
  operational_stats_test();
LAB_0011311f:
  pkStack_16f0 = (kvs_ops_stat *)0x113131;
  operational_stats_test();
  pfVar21 = (fdb_doc *)__s;
LAB_00113131:
  __s = (code *)pfVar21;
  pkStack_16f0 = (kvs_ops_stat *)0x113136;
  operational_stats_test();
LAB_00113136:
  pkStack_16f0 = (kvs_ops_stat *)0x113141;
  operational_stats_test();
LAB_00113141:
  pkStack_16f0 = (kvs_ops_stat *)0x113146;
  operational_stats_test();
LAB_00113146:
  pkStack_16f0 = (kvs_ops_stat *)0x113158;
  operational_stats_test();
LAB_00113158:
  pkStack_16f0 = (kvs_ops_stat *)0x113163;
  operational_stats_test();
LAB_00113163:
  pkStack_16f0 = (kvs_ops_stat *)0x113168;
  operational_stats_test();
LAB_00113168:
  pkStack_16f0 = (kvs_ops_stat *)0x11316d;
  operational_stats_test();
LAB_0011316d:
  pkStack_16f0 = (kvs_ops_stat *)0x113172;
  operational_stats_test();
LAB_00113172:
  pkStack_16f0 = (kvs_ops_stat *)0x113184;
  operational_stats_test();
LAB_00113184:
  pkStack_16f0 = (kvs_ops_stat *)0x113189;
  operational_stats_test();
LAB_00113189:
  pkStack_16f0 = (kvs_ops_stat *)0x11318e;
  operational_stats_test();
LAB_0011318e:
  pfVar20 = (fdb_kvs_handle *)auStack_1698;
  pkStack_16f0 = (kvs_ops_stat *)0x1131a0;
  operational_stats_test();
LAB_001131a0:
  pkStack_16f0 = (kvs_ops_stat *)0x1131a5;
  operational_stats_test();
  pfVar21 = pfVar24;
LAB_001131a5:
  pkStack_16f0 = (kvs_ops_stat *)_worker_thread;
  operational_stats_test();
  pfStack_1718 = fconfig;
  pfStack_1710 = info_00;
  pfStack_1708 = (fdb_doc *)__s;
  pbStack_1700 = (btree *)info_01;
  pfStack_16f8 = pfVar21;
  pkStack_16f0 = (kvs_ops_stat *)info;
  gettimeofday(&tStack_1b78,(__timezone_ptr_t)0x0);
  pfStack_1bc0 = (fdb_doc *)0x0;
  sprintf(acStack_1b20,"dummy%d",(ulong)*(uint *)&pfVar20->file->filename);
  fdb_open(&pfStack_1bb8,acStack_1b20,(fdb_config *)pfVar20->btreeblkops);
  fdb_kvs_open_default(pfStack_1bb8,&pfStack_1ba8,(fdb_kvs_config *)pfVar20->fileops);
  fVar6 = fdb_set_log_callback(pfStack_1ba8,logCallbackFunc,"worker_thread");
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar20->dhandle);
  *(int *)(pfVar20->field_6).seqtree = *(int *)(pfVar20->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar20->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar20->dhandle);
    pbVar22 = (pfVar20->field_6).seqtree;
    iVar7._0_1_ = pbVar22->ksize;
    iVar7._1_1_ = pbVar22->vsize;
    iVar7._2_2_ = pbVar22->height;
    if ((list *)(pfVar20->kvs_config).custom_cmp == (list *)(long)iVar7) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar20->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar20->dhandle);
  gettimeofday((timeval *)&tStack_1b88,(__timezone_ptr_t)0x0);
  uStack_1ba9 = 0;
  uVar13 = 0;
  iStack_1bc4 = 0;
  do {
    iVar7 = rand();
    iVar7 = (int)((ulong)(long)iVar7 % (ulong)(pfVar20->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar20->op_stats->num_sets)[iVar7].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_1bc0,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar6 = fdb_get(pfStack_1ba8,pfStack_1bc0);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_1bc0->body;
    plVar3 = *(long **)((&pfVar20->op_stats->num_sets)[iVar7].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar20->kvs != (kvs_info *)0x0) {
      uStack_1bb0 = (undefined4)plVar2[1];
      uStack_1bac = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar7 = atoi((char *)&uStack_1bb0);
      sprintf((char *)&uStack_1bb0,"%0 7d",(ulong)(iVar7 + 1));
      pvVar4 = pfStack_1bc0->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_1bac,uStack_1bb0._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_1bb0;
      fVar6 = fdb_set(pfStack_1ba8,pfStack_1bc0);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar20->trie != (hbtrie *)0x0) && (uVar13 % (ulong)pfVar20->trie == 0)) {
        fdb_commit(pfStack_1bb8,'\0');
        iStack_1bc4 = iStack_1bc4 + 1;
        fdb_get_file_info(pfStack_1bb8,&fStack_1b68);
        if ((pfVar20->staletree == (btree *)(long)iStack_1bc4) &&
           (((pfVar20->staletree != (btree *)0x0 && (fStack_1b68.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar20->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar20->dhandle);
          uStack_1b9c = *(int *)&pfVar20->file->filename + 1;
          *(uint *)&pfVar20->file->filename = uStack_1b9c;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar20->dhandle);
          iStack_1bc4 = 0;
          sprintf(acStack_1b20,"dummy%d",(ulong)uStack_1b9c);
          fVar6 = fdb_compact(pfStack_1bb8,acStack_1b20);
          if (fVar6 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar20->dhandle);
            *(int *)&pfVar20->file->filename = *(int *)&pfVar20->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar20->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_1bc0);
    pfStack_1bc0 = (fdb_doc *)0x0;
    uVar13 = uVar13 + 1;
    gettimeofday((timeval *)&tStack_1b98,(__timezone_ptr_t)0x0);
    tVar26 = _utime_gap(tStack_1b88,tStack_1b98);
  } while ((fdb_file_handle *)tVar26.tv_sec < pfVar20->fhandle);
  pcVar18 = "writer";
  if (pfVar20->kvs == (kvs_info *)0x0) {
    pcVar18 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar20->kvs_config,pcVar18,
         uVar13 & 0xffffffff);
  pfVar20->bhandle = (btreeblk_handle *)(uVar13 & 0xffffffff);
  fdb_commit(pfStack_1bb8,'\x01');
  fdb_kvs_close(pfStack_1ba8);
  fdb_close(pfStack_1bb8);
  pthread_exit((void *)0x0);
}

Assistant:

void db_close_and_remove()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.cleanup_cache_onclose = false;
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // write to db
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // remove dbfile
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // re-open read-only
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("db close and remove");
}